

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

bool __thiscall
lzham::lzcompressor::greedy_parse(lzcompressor *this,parse_thread_state *parse_state)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  vector<lzham::lzcompressor::lzpriced_decision> *this_00;
  long in_RSI;
  vector<lzham::lzcompressor::lzpriced_decision> *in_RDI;
  uint match_len;
  lzpriced_decision *dec;
  int largest_dec_index;
  uint max_admissable_match_len;
  vector<lzham::lzcompressor::lzpriced_decision> *decisions;
  state *approx_state;
  state *in_stack_00000038;
  uint cur_ofs;
  uint cur_lookahead_ofs;
  uint cur_dict_ofs;
  uint lookahead_start_ofs;
  uint bytes_to_parse;
  uint in_stack_ffffffffffffff9c;
  int iVar5;
  uint in_stack_ffffffffffffffac;
  uint local_2c;
  
  *(undefined1 *)(in_RSI + 0x15675e) = 1;
  *(undefined1 *)(in_RSI + 0x156728) = 0;
  uVar1 = *(uint *)(in_RSI + 4);
  uVar3 = search_accelerator::get_lookahead_pos((search_accelerator *)(in_RDI + 5));
  search_accelerator::get_max_dict_size_mask((search_accelerator *)(in_RDI + 5));
  local_2c = 0;
  this_00 = (vector<lzham::lzcompressor::lzpriced_decision> *)(in_RSI + 0x156730);
  bVar2 = vector<lzham::lzcompressor::lzpriced_decision>::try_reserve
                    (in_RDI,in_stack_ffffffffffffff9c);
  if ((bVar2) &&
     (bVar2 = vector<lzham::lzcompressor::lzdecision>::try_resize
                        ((vector<lzham::lzcompressor::lzdecision> *)
                         CONCAT44(in_stack_ffffffffffffffac,uVar3),(uint)((ulong)in_RDI >> 0x20),
                         SUB81((ulong)in_RDI >> 0x18,0)), bVar2)) {
    do {
      if (uVar1 <= local_2c) {
        *(uint *)(in_RSI + 0x156750) = local_2c;
        *(undefined1 *)(in_RSI + 0x15675e) = 0;
        *(undefined4 *)(in_RSI + 0x156758) = *(undefined4 *)(in_RSI + 4);
        return true;
      }
      if (uVar1 - local_2c < 0x10001) {
        iVar5 = uVar1 - local_2c;
      }
      else {
        iVar5 = 0x10000;
      }
      uVar4 = enumerate_lz_decisions
                        (_lookahead_start_ofs,cur_dict_ofs,in_stack_00000038,
                         (vector<lzham::lzcompressor::lzpriced_decision> *)approx_state,
                         decisions._4_4_,(uint)decisions);
      if ((int)uVar4 < 0) {
        return false;
      }
      vector<lzham::lzcompressor::lzpriced_decision>::operator[](this_00,uVar4);
      bVar2 = vector<lzham::lzcompressor::lzdecision>::try_push_back
                        ((vector<lzham::lzcompressor::lzdecision> *)
                         CONCAT44(in_stack_ffffffffffffffac,uVar3),(lzdecision *)in_RDI);
      if (!bVar2) {
        return false;
      }
      state_base::partial_advance((state_base *)this_00,(lzdecision *)CONCAT44(iVar5,uVar4));
      in_stack_ffffffffffffffac = lzdecision::get_len((lzdecision *)0x112e4b);
      local_2c = in_stack_ffffffffffffffac + local_2c;
      uVar4 = vector<lzham::lzcompressor::lzdecision>::size
                        ((vector<lzham::lzcompressor::lzdecision> *)(in_RSI + 0x156710));
    } while (uVar4 < *(uint *)(in_RSI + 0x15674c));
    *(uint *)(in_RSI + 0x156750) = local_2c;
    *(uint *)(in_RSI + 0x156758) = local_2c;
    *(undefined1 *)(in_RSI + 0x15675c) = 1;
  }
  return false;
}

Assistant:

bool lzcompressor::greedy_parse(parse_thread_state &parse_state)
   {
      parse_state.m_failed = true;
      parse_state.m_emit_decisions_backwards = false;

      const uint bytes_to_parse = parse_state.m_bytes_to_match;

      const uint lookahead_start_ofs = m_accel.get_lookahead_pos() & m_accel.get_max_dict_size_mask();

      uint cur_dict_ofs = parse_state.m_start_ofs;
      uint cur_lookahead_ofs = cur_dict_ofs - lookahead_start_ofs;
      uint cur_ofs = 0;

      state &approx_state = *parse_state.m_pState;

      lzham::vector<lzpriced_decision> &decisions = parse_state.m_temp_decisions;

      if (!decisions.try_reserve(384))
      {
         LZHAM_LOG_ERROR(7042);
         return false;
      }

      if (!parse_state.m_best_decisions.try_resize(0))
      {
         LZHAM_LOG_ERROR(7043);
         return false;
      }

      while (cur_ofs < bytes_to_parse)
      {
         const uint max_admissable_match_len = LZHAM_MIN(static_cast<uint>(CLZBase::cMaxHugeMatchLen), bytes_to_parse - cur_ofs);

         int largest_dec_index = enumerate_lz_decisions(cur_dict_ofs, approx_state, decisions, 1, max_admissable_match_len);
         if (largest_dec_index < 0)
         {
            LZHAM_LOG_ERROR(7044);
            return false;
         }

         const lzpriced_decision &dec = decisions[largest_dec_index];

         if (!parse_state.m_best_decisions.try_push_back(dec))
         {
            LZHAM_LOG_ERROR(7045);
            return false;
         }

         approx_state.partial_advance(dec);

         uint match_len = dec.get_len();
         LZHAM_ASSERT(match_len <= max_admissable_match_len);
         cur_dict_ofs += match_len;
         cur_lookahead_ofs += match_len;
         cur_ofs += match_len;

         if (parse_state.m_best_decisions.size() >= parse_state.m_max_greedy_decisions)
         {
            parse_state.m_greedy_parse_total_bytes_coded = cur_ofs;
            parse_state.m_bytes_actually_parsed = cur_ofs;
            parse_state.m_greedy_parse_gave_up = true;
            return false;
         }
      }

      parse_state.m_greedy_parse_total_bytes_coded = cur_ofs;

      LZHAM_ASSERT(cur_ofs == bytes_to_parse);

      parse_state.m_failed = false;
      parse_state.m_bytes_actually_parsed = parse_state.m_bytes_to_match;

      return true;
   }